

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

LY_ERR yang_print_compiled(ly_out *out,lys_module *module,uint32_t options)

{
  undefined2 uVar1;
  uint local_ac;
  lysc_module *local_a0;
  uint local_8c;
  lysc_node_notif *local_70;
  lysc_node_notif *notif;
  lysc_node_action *rpc;
  lysc_node *data;
  lys_ypr_ctx *pctx;
  lys_ypr_ctx pctx_;
  lysc_module *modc;
  uint64_t u;
  uint32_t options_local;
  lys_module *module_local;
  ly_out *out_local;
  
  pctx_._24_8_ = module->compiled;
  pctx_.field_0._0_2_ = 0;
  pctx_.field_0._2_2_ = 0;
  pctx_.field_0._16_4_ = 1;
  pctx = (lys_ypr_ctx *)out;
  pctx_.field_0._4_4_ = options;
  pctx_.field_0._8_8_ = module;
  ly_print_(out,"%*smodule %s {\n",0,"");
  pctx_.field_0._0_2_ = pctx_.field_0._0_2_ + 1;
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_NAMESPACE,'\0',module->ns,'\0',
              *(void **)(pctx_._24_8_ + 0x20));
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_PREFIX,'\0',module->prefix,'\0',
              *(void **)(pctx_._24_8_ + 0x20));
  if (((((module->org != (char *)0x0) || (module->contact != (char *)0x0)) ||
       (module->dsc != (char *)0x0)) ||
      (uVar1 = pctx_.field_0._2_2_ | 1, module->ref != (char *)0x0)) &&
     (pctx_.field_0._2_2_ = pctx_.field_0._2_2_ & 0xfffe, uVar1 = pctx_.field_0._2_2_,
     (pctx_.field_0._4_4_ & 2) == 0)) {
    ly_print_((ly_out *)pctx,"\n");
    uVar1 = pctx_.field_0._2_2_;
  }
  pctx_.field_0._2_2_ = uVar1;
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_ORGANIZATION,'\0',module->org,'\0',
              *(void **)(pctx_._24_8_ + 0x20));
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_CONTACT,'\0',module->contact,'\0',
              *(void **)(pctx_._24_8_ + 0x20));
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_DESCRIPTION,'\0',module->dsc,'\0',
              *(void **)(pctx_._24_8_ + 0x20));
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_REFERENCE,'\0',module->ref,'\0',
              *(void **)(pctx_._24_8_ + 0x20));
  if (((module->org != (char *)0x0) || (module->contact != (char *)0x0)) ||
     ((module->dsc != (char *)0x0 || (module->ref != (char *)0x0)))) {
    pctx_.field_0._2_2_ = pctx_.field_0._2_2_ | 1;
  }
  if (module->revision != (char *)0x0) {
    if (((pctx_.field_0._2_2_ & 1) != 0) &&
       (pctx_.field_0._2_2_ = pctx_.field_0._2_2_ & 0xfffe, (pctx_.field_0._4_4_ & 2) == 0)) {
      ly_print_((ly_out *)pctx,"\n");
    }
    if ((pctx_.field_0._4_4_ & 2) == 0) {
      local_8c = (uint)(ushort)pctx_.field_0._0_2_ << 1;
    }
    else {
      local_8c = 0;
    }
    ly_print_((ly_out *)pctx,"%*srevision %s;\n",(ulong)local_8c,"",module->revision);
    pctx_.field_0._2_2_ = pctx_.field_0._2_2_ | 1;
  }
  if (*(long *)(pctx_._24_8_ + 0x20) != 0) {
    if (((pctx_.field_0._2_2_ & 1) != 0) &&
       (pctx_.field_0._2_2_ = pctx_.field_0._2_2_ & 0xfffe, (pctx_.field_0._4_4_ & 2) == 0)) {
      ly_print_((ly_out *)pctx,"\n");
    }
    yprc_extension_instances
              ((lys_ypr_ctx *)&pctx,LY_STMT_MODULE,'\0',module->compiled->exts,(ly_bool *)0x0);
    pctx_.field_0._2_2_ = pctx_.field_0._2_2_ | 1;
  }
  modc = (lysc_module *)0x0;
  while( true ) {
    if (module->identities == (lysc_ident *)0x0) {
      local_a0 = (lysc_module *)0x0;
    }
    else {
      local_a0 = *(lysc_module **)&module->identities[-1].flags;
    }
    if (local_a0 <= modc) break;
    if (((pctx_.field_0._2_2_ & 1) != 0) &&
       (pctx_.field_0._2_2_ = pctx_.field_0._2_2_ & 0xfffe, (pctx_.field_0._4_4_ & 2) == 0)) {
      ly_print_((ly_out *)pctx,"\n");
    }
    yprc_identity((lys_ypr_ctx *)&pctx,module->identities + (long)modc);
    pctx_.field_0._2_2_ = pctx_.field_0._2_2_ | 1;
    modc = (lysc_module *)((long)&modc->mod + 1);
  }
  if ((pctx_.field_0._4_4_ & 0x10) == 0) {
    for (rpc = *(lysc_node_action **)(pctx_._24_8_ + 8); rpc != (lysc_node_action *)0x0;
        rpc = (rpc->field_0).field_1.next) {
      if (((pctx_.field_0._2_2_ & 1) != 0) &&
         (pctx_.field_0._2_2_ = pctx_.field_0._2_2_ & 0xfffe, (pctx_.field_0._4_4_ & 2) == 0)) {
        ly_print_((ly_out *)pctx,"\n");
      }
      yprc_node((lys_ypr_ctx *)&pctx,(lysc_node *)rpc);
    }
    if (*(long *)(pctx_._24_8_ + 8) != 0) {
      pctx_.field_0._2_2_ = pctx_.field_0._2_2_ | 1;
    }
    for (notif = *(lysc_node_notif **)(pctx_._24_8_ + 0x10); notif != (lysc_node_notif *)0x0;
        notif = (notif->field_0).field_1.next) {
      if (((pctx_.field_0._2_2_ & 1) != 0) &&
         (pctx_.field_0._2_2_ = pctx_.field_0._2_2_ & 0xfffe, (pctx_.field_0._4_4_ & 2) == 0)) {
        ly_print_((ly_out *)pctx,"\n");
      }
      yprc_action((lys_ypr_ctx *)&pctx,(lysc_node_action *)notif);
    }
    if (*(long *)(pctx_._24_8_ + 0x10) != 0) {
      pctx_.field_0._2_2_ = pctx_.field_0._2_2_ | 1;
    }
    for (local_70 = *(lysc_node_notif **)(pctx_._24_8_ + 0x18); local_70 != (lysc_node_notif *)0x0;
        local_70 = (local_70->field_0).field_1.next) {
      if (((pctx_.field_0._2_2_ & 1) != 0) &&
         (pctx_.field_0._2_2_ = pctx_.field_0._2_2_ & 0xfffe, (pctx_.field_0._4_4_ & 2) == 0)) {
        ly_print_((ly_out *)pctx,"\n");
      }
      yprc_notification((lys_ypr_ctx *)&pctx,local_70);
    }
    if (*(long *)(pctx_._24_8_ + 0x18) != 0) {
      pctx_.field_0._2_2_ = pctx_.field_0._2_2_ | 1;
    }
  }
  pctx_.field_0._0_2_ = pctx_.field_0._0_2_ - 1;
  if ((pctx_.field_0._4_4_ & 2) == 0) {
    local_ac = (uint)(ushort)pctx_.field_0._0_2_ << 1;
  }
  else {
    local_ac = 0;
  }
  ly_print_(out,"%*s}\n",(ulong)local_ac,"");
  ly_print_flush(out);
  return LY_SUCCESS;
}

Assistant:

LY_ERR
yang_print_compiled(struct ly_out *out, const struct lys_module *module, uint32_t options)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_module *modc = module->compiled;
    struct lys_ypr_ctx pctx_ = {
        .out = out,
        .level = 0,
        .options = options,
        .module = module,
        .schema = LYS_YPR_COMPILED
    }, *pctx = &pctx_;

    ly_print_(pctx->out, "%*smodule %s {\n", INDENT, module->name);
    LEVEL++;

    /* module-header-stmts */
    ypr_substmt(pctx, LY_STMT_NAMESPACE, 0, module->ns, 0, modc->exts);
    ypr_substmt(pctx, LY_STMT_PREFIX, 0, module->prefix, 0, modc->exts);

    YPR_EXTRA_LINE(1, pctx);

    /* no linkage-stmts */

    /* meta-stmts */
    if (module->org || module->contact || module->dsc || module->ref) {
        YPR_EXTRA_LINE_PRINT(pctx);
    }
    ypr_substmt(pctx, LY_STMT_ORGANIZATION, 0, module->org, 0, modc->exts);
    ypr_substmt(pctx, LY_STMT_CONTACT, 0, module->contact, 0, modc->exts);
    ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, module->dsc, 0, modc->exts);
    ypr_substmt(pctx, LY_STMT_REFERENCE, 0, module->ref, 0, modc->exts);

    YPR_EXTRA_LINE(module->org || module->contact || module->dsc || module->ref, pctx);

    /* revision-stmts */
    if (module->revision) {
        YPR_EXTRA_LINE_PRINT(pctx);
        ly_print_(pctx->out, "%*srevision %s;\n", INDENT, module->revision);
        YPR_EXTRA_LINE(1, pctx);
    }

    /* body-stmts */
    if (modc->exts) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprc_extension_instances(pctx, LY_STMT_MODULE, 0, module->compiled->exts, NULL);
        YPR_EXTRA_LINE(1, pctx);
    }

    LY_ARRAY_FOR(module->identities, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprc_identity(pctx, &module->identities[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    if (!(pctx->options & LYS_PRINT_NO_SUBSTMT)) {
        struct lysc_node *data;
        struct lysc_node_action *rpc;
        struct lysc_node_notif *notif;

        LY_LIST_FOR(modc->data, data) {
            YPR_EXTRA_LINE_PRINT(pctx);
            yprc_node(pctx, data);
        }

        YPR_EXTRA_LINE(modc->data, pctx);

        LY_LIST_FOR(modc->rpcs, rpc) {
            YPR_EXTRA_LINE_PRINT(pctx);
            yprc_action(pctx, rpc);
        }

        YPR_EXTRA_LINE(modc->rpcs, pctx);

        LY_LIST_FOR(modc->notifs, notif) {
            YPR_EXTRA_LINE_PRINT(pctx);
            yprc_notification(pctx, notif);
        }

        YPR_EXTRA_LINE(modc->notifs, pctx);
    }

    LEVEL--;
    ly_print_(out, "%*s}\n", INDENT);
    ly_print_flush(out);

    return LY_SUCCESS;
}